

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  Primitive *prim;
  ulong uVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  bool bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  RayHit *local_24b8;
  RayQueryContext *local_24b0;
  long local_24a8;
  undefined1 local_24a0 [32];
  undefined4 local_2480;
  undefined4 uStack_247c;
  undefined4 uStack_2478;
  undefined4 uStack_2474;
  undefined4 uStack_2470;
  undefined4 uStack_246c;
  undefined4 uStack_2468;
  undefined4 uStack_2464;
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  pauVar29 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  aVar2 = (ray->super_RayK<1>).dir.field_0;
  auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar38 = vandps_avx((undefined1  [16])aVar2,auVar38);
  auVar40._8_4_ = 0x219392ef;
  auVar40._0_8_ = 0x219392ef219392ef;
  auVar40._12_4_ = 0x219392ef;
  auVar38 = vcmpps_avx(auVar38,auVar40,1);
  auVar38 = vblendvps_avx((undefined1  [16])aVar2,auVar40,auVar38);
  auVar40 = vrcpps_avx(auVar38);
  fVar6 = auVar40._0_4_;
  auVar35._0_4_ = auVar38._0_4_ * fVar6;
  fVar7 = auVar40._4_4_;
  auVar35._4_4_ = auVar38._4_4_ * fVar7;
  fVar8 = auVar40._8_4_;
  auVar35._8_4_ = auVar38._8_4_ * fVar8;
  fVar9 = auVar40._12_4_;
  auVar35._12_4_ = auVar38._12_4_ * fVar9;
  auVar41._8_4_ = 0x3f800000;
  auVar41._0_8_ = 0x3f8000003f800000;
  auVar41._12_4_ = 0x3f800000;
  auVar38 = vsubps_avx(auVar41,auVar35);
  local_2460 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  uStack_245c = local_2460;
  uStack_2458 = local_2460;
  uStack_2454 = local_2460;
  uStack_2450 = local_2460;
  uStack_244c = local_2460;
  uStack_2448 = local_2460;
  uStack_2444 = local_2460;
  local_2480 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  uStack_247c = local_2480;
  uStack_2478 = local_2480;
  uStack_2474 = local_2480;
  uStack_2470 = local_2480;
  uStack_246c = local_2480;
  uStack_2468 = local_2480;
  uStack_2464 = local_2480;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_23c0._4_4_ = uVar1;
  local_23c0._0_4_ = uVar1;
  local_23c0._8_4_ = uVar1;
  local_23c0._12_4_ = uVar1;
  local_23c0._16_4_ = uVar1;
  local_23c0._20_4_ = uVar1;
  local_23c0._24_4_ = uVar1;
  local_23c0._28_4_ = uVar1;
  auVar44 = ZEXT3264(local_23c0);
  auVar36._0_4_ = fVar6 + fVar6 * auVar38._0_4_;
  auVar36._4_4_ = fVar7 + fVar7 * auVar38._4_4_;
  auVar36._8_4_ = fVar8 + fVar8 * auVar38._8_4_;
  auVar36._12_4_ = fVar9 + fVar9 * auVar38._12_4_;
  auVar38 = vshufps_avx(auVar36,auVar36,0);
  local_23e0._16_16_ = auVar38;
  local_23e0._0_16_ = auVar38;
  auVar45 = ZEXT3264(local_23e0);
  auVar38 = vmovshdup_avx(auVar36);
  auVar40 = vshufps_avx(auVar36,auVar36,0x55);
  local_2400._16_16_ = auVar40;
  local_2400._0_16_ = auVar40;
  auVar46 = ZEXT3264(local_2400);
  auVar40 = vshufpd_avx(auVar36,auVar36,1);
  auVar35 = vshufps_avx(auVar36,auVar36,0xaa);
  local_2420._16_16_ = auVar35;
  local_2420._0_16_ = auVar35;
  auVar47 = ZEXT3264(local_2420);
  uVar24 = (ulong)(auVar36._0_4_ < 0.0) << 5;
  uVar25 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
  uVar23 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
  uVar27 = uVar24 ^ 0x20;
  uVar21 = uVar25 ^ 0x20;
  uVar28 = uVar23 ^ 0x20;
  auVar38 = vshufps_avx(auVar32,auVar32,0);
  local_2440._16_16_ = auVar38;
  local_2440._0_16_ = auVar38;
  auVar48 = ZEXT3264(local_2440);
  auVar38 = vshufps_avx(auVar34,auVar34,0);
  auVar31._16_16_ = auVar38;
  auVar31._0_16_ = auVar38;
  local_24d0 = uVar23;
  local_24c8 = uVar25;
  local_24c0 = uVar24;
  local_24b8 = ray;
  local_24b0 = context;
  do {
    auVar39 = ZEXT3264(CONCAT428(uStack_2444,
                                 CONCAT424(uStack_2448,
                                           CONCAT420(uStack_244c,
                                                     CONCAT416(uStack_2450,
                                                               CONCAT412(uStack_2454,
                                                                         CONCAT48(uStack_2458,
                                                                                  CONCAT44(
                                                  uStack_245c,local_2460))))))));
    auVar43 = ZEXT3264(CONCAT428(uStack_2464,
                                 CONCAT424(uStack_2468,
                                           CONCAT420(uStack_246c,
                                                     CONCAT416(uStack_2470,
                                                               CONCAT412(uStack_2474,
                                                                         CONCAT48(uStack_2478,
                                                                                  CONCAT44(
                                                  uStack_247c,local_2480))))))));
LAB_00e7d309:
    do {
      if (pauVar29 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar18 = pauVar29 + -1;
      pauVar29 = pauVar29 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar18 + 8));
    uVar19 = *(ulong *)*pauVar29;
LAB_00e7d32e:
    if ((uVar19 & 8) == 0) {
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar24),auVar39._0_32_);
      auVar11._4_4_ = auVar45._4_4_ * auVar10._4_4_;
      auVar11._0_4_ = auVar45._0_4_ * auVar10._0_4_;
      auVar11._8_4_ = auVar45._8_4_ * auVar10._8_4_;
      auVar11._12_4_ = auVar45._12_4_ * auVar10._12_4_;
      auVar11._16_4_ = auVar45._16_4_ * auVar10._16_4_;
      auVar11._20_4_ = auVar45._20_4_ * auVar10._20_4_;
      auVar11._24_4_ = auVar45._24_4_ * auVar10._24_4_;
      auVar11._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar25),auVar43._0_32_);
      auVar12._4_4_ = auVar46._4_4_ * auVar10._4_4_;
      auVar12._0_4_ = auVar46._0_4_ * auVar10._0_4_;
      auVar12._8_4_ = auVar46._8_4_ * auVar10._8_4_;
      auVar12._12_4_ = auVar46._12_4_ * auVar10._12_4_;
      auVar12._16_4_ = auVar46._16_4_ * auVar10._16_4_;
      auVar12._20_4_ = auVar46._20_4_ * auVar10._20_4_;
      auVar12._24_4_ = auVar46._24_4_ * auVar10._24_4_;
      auVar12._28_4_ = auVar10._28_4_;
      auVar10 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar23),auVar44._0_32_);
      auVar13._4_4_ = auVar47._4_4_ * auVar11._4_4_;
      auVar13._0_4_ = auVar47._0_4_ * auVar11._0_4_;
      auVar13._8_4_ = auVar47._8_4_ * auVar11._8_4_;
      auVar13._12_4_ = auVar47._12_4_ * auVar11._12_4_;
      auVar13._16_4_ = auVar47._16_4_ * auVar11._16_4_;
      auVar13._20_4_ = auVar47._20_4_ * auVar11._20_4_;
      auVar13._24_4_ = auVar47._24_4_ * auVar11._24_4_;
      auVar13._28_4_ = auVar11._28_4_;
      auVar11 = vmaxps_avx(auVar13,auVar48._0_32_);
      local_24a0 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar27),auVar39._0_32_);
      auVar14._4_4_ = auVar45._4_4_ * auVar10._4_4_;
      auVar14._0_4_ = auVar45._0_4_ * auVar10._0_4_;
      auVar14._8_4_ = auVar45._8_4_ * auVar10._8_4_;
      auVar14._12_4_ = auVar45._12_4_ * auVar10._12_4_;
      auVar14._16_4_ = auVar45._16_4_ * auVar10._16_4_;
      auVar14._20_4_ = auVar45._20_4_ * auVar10._20_4_;
      auVar14._24_4_ = auVar45._24_4_ * auVar10._24_4_;
      auVar14._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar21),auVar43._0_32_);
      auVar15._4_4_ = auVar46._4_4_ * auVar10._4_4_;
      auVar15._0_4_ = auVar46._0_4_ * auVar10._0_4_;
      auVar15._8_4_ = auVar46._8_4_ * auVar10._8_4_;
      auVar15._12_4_ = auVar46._12_4_ * auVar10._12_4_;
      auVar15._16_4_ = auVar46._16_4_ * auVar10._16_4_;
      auVar15._20_4_ = auVar46._20_4_ * auVar10._20_4_;
      auVar15._24_4_ = auVar46._24_4_ * auVar10._24_4_;
      auVar15._28_4_ = auVar10._28_4_;
      auVar10 = vminps_avx(auVar14,auVar15);
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar28),auVar44._0_32_);
      auVar16._4_4_ = auVar47._4_4_ * auVar11._4_4_;
      auVar16._0_4_ = auVar47._0_4_ * auVar11._0_4_;
      auVar16._8_4_ = auVar47._8_4_ * auVar11._8_4_;
      auVar16._12_4_ = auVar47._12_4_ * auVar11._12_4_;
      auVar16._16_4_ = auVar47._16_4_ * auVar11._16_4_;
      auVar16._20_4_ = auVar47._20_4_ * auVar11._20_4_;
      auVar16._24_4_ = auVar47._24_4_ * auVar11._24_4_;
      auVar16._28_4_ = auVar11._28_4_;
      auVar11 = vminps_avx(auVar16,auVar31);
      auVar10 = vminps_avx(auVar10,auVar11);
      auVar10 = vcmpps_avx(local_24a0,auVar10,2);
      uVar17 = vmovmskps_avx(auVar10);
      if (uVar17 != 0) {
        uVar17 = uVar17 & 0xff;
        uVar26 = uVar19 & 0xfffffffffffffff0;
        lVar20 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
        uVar19 = *(ulong *)(uVar26 + lVar20 * 8);
        uVar17 = uVar17 - 1 & uVar17;
        if (uVar17 != 0) {
          uVar3 = *(uint *)(local_24a0 + lVar20 * 4);
          lVar20 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar26 + lVar20 * 8);
          uVar4 = *(uint *)(local_24a0 + lVar20 * 4);
          uVar17 = uVar17 - 1 & uVar17;
          uVar23 = local_24d0;
          if (uVar17 != 0) {
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar19;
            auVar38 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar3));
            auVar34._8_8_ = 0;
            auVar34._0_8_ = uVar5;
            auVar32 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar4));
            lVar20 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(uVar26 + lVar20 * 8);
            auVar40 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_24a0 + lVar20 * 4)));
            auVar34 = vpcmpgtd_avx(auVar32,auVar38);
            uVar17 = uVar17 - 1 & uVar17;
            if (uVar17 == 0) {
              auVar35 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar32,auVar38,auVar35);
              auVar38 = vblendvps_avx(auVar38,auVar32,auVar35);
              auVar32 = vpcmpgtd_avx(auVar40,auVar34);
              auVar35 = vpshufd_avx(auVar32,0xaa);
              auVar32 = vblendvps_avx(auVar40,auVar34,auVar35);
              auVar34 = vblendvps_avx(auVar34,auVar40,auVar35);
              auVar40 = vpcmpgtd_avx(auVar34,auVar38);
              auVar35 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar34,auVar38,auVar35);
              auVar38 = vblendvps_avx(auVar38,auVar34,auVar35);
              *pauVar29 = auVar38;
              pauVar29[1] = auVar40;
              uVar19 = auVar32._0_8_;
              pauVar18 = pauVar29 + 2;
            }
            else {
              lVar20 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(uVar26 + lVar20 * 8);
              auVar35 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_24a0 + lVar20 * 4)));
              uVar17 = uVar17 - 1 & uVar17;
              uVar19 = (ulong)uVar17;
              if (uVar17 == 0) {
                auVar36 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar32,auVar38,auVar36);
                auVar38 = vblendvps_avx(auVar38,auVar32,auVar36);
                auVar32 = vpcmpgtd_avx(auVar35,auVar40);
                auVar36 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar35,auVar40,auVar36);
                auVar40 = vblendvps_avx(auVar40,auVar35,auVar36);
                auVar35 = vpcmpgtd_avx(auVar40,auVar38);
                auVar36 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar40,auVar38,auVar36);
                auVar38 = vblendvps_avx(auVar38,auVar40,auVar36);
                auVar40 = vpcmpgtd_avx(auVar32,auVar34);
                auVar36 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar32,auVar34,auVar36);
                auVar32 = vblendvps_avx(auVar34,auVar32,auVar36);
                auVar34 = vpcmpgtd_avx(auVar35,auVar32);
                auVar36 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar35,auVar32,auVar36);
                auVar32 = vblendvps_avx(auVar32,auVar35,auVar36);
                *pauVar29 = auVar38;
                pauVar29[1] = auVar32;
                pauVar29[2] = auVar34;
                auVar39 = ZEXT3264(CONCAT428(uStack_2444,
                                             CONCAT424(uStack_2448,
                                                       CONCAT420(uStack_244c,
                                                                 CONCAT416(uStack_2450,
                                                                           CONCAT412(uStack_2454,
                                                                                     CONCAT48(
                                                  uStack_2458,CONCAT44(uStack_245c,local_2460)))))))
                                  );
                auVar43 = ZEXT3264(CONCAT428(uStack_2464,
                                             CONCAT424(uStack_2468,
                                                       CONCAT420(uStack_246c,
                                                                 CONCAT416(uStack_2470,
                                                                           CONCAT412(uStack_2474,
                                                                                     CONCAT48(
                                                  uStack_2478,CONCAT44(uStack_247c,local_2480)))))))
                                  );
                uVar19 = auVar40._0_8_;
                pauVar29 = pauVar29 + 3;
                goto LAB_00e7d32e;
              }
              *pauVar29 = auVar38;
              pauVar29[1] = auVar32;
              pauVar29[2] = auVar40;
              pauVar18 = pauVar29 + 3;
              pauVar29[3] = auVar35;
              do {
                lVar20 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)(uVar26 + lVar20 * 8);
                auVar38 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_24a0 + lVar20 * 4)));
                pauVar18[1] = auVar38;
                pauVar18 = pauVar18 + 1;
                uVar19 = uVar19 & uVar19 - 1;
              } while (uVar19 != 0);
              lVar20 = 0;
              while (pauVar18 != pauVar29) {
                auVar38 = pauVar29[1];
                uVar17 = vextractps_avx(auVar38,2);
                for (lVar22 = 0x10;
                    (lVar20 != lVar22 && (*(uint *)(pauVar29[-1] + lVar22 + 8) < uVar17));
                    lVar22 = lVar22 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar29 + lVar22) =
                       *(undefined1 (*) [16])(pauVar29[-1] + lVar22);
                }
                *(undefined1 (*) [16])(*pauVar29 + lVar22) = auVar38;
                lVar20 = lVar20 + -0x10;
                pauVar29 = pauVar29 + 1;
              }
              uVar19 = *(ulong *)*pauVar18;
            }
            auVar39 = ZEXT3264(CONCAT428(uStack_2444,
                                         CONCAT424(uStack_2448,
                                                   CONCAT420(uStack_244c,
                                                             CONCAT416(uStack_2450,
                                                                       CONCAT412(uStack_2454,
                                                                                 CONCAT48(
                                                  uStack_2458,CONCAT44(uStack_245c,local_2460)))))))
                              );
            auVar43 = ZEXT3264(CONCAT428(uStack_2464,
                                         CONCAT424(uStack_2468,
                                                   CONCAT420(uStack_246c,
                                                             CONCAT416(uStack_2470,
                                                                       CONCAT412(uStack_2474,
                                                                                 CONCAT48(
                                                  uStack_2478,CONCAT44(uStack_247c,local_2480)))))))
                              );
            pauVar29 = pauVar18;
            goto LAB_00e7d32e;
          }
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar29 = uVar5;
            *(uint *)(*pauVar29 + 8) = uVar4;
            pauVar29 = pauVar29 + 1;
          }
          else {
            *(ulong *)*pauVar29 = uVar19;
            *(uint *)(*pauVar29 + 8) = uVar3;
            uVar19 = uVar5;
            pauVar29 = pauVar29 + 1;
          }
        }
        goto LAB_00e7d32e;
      }
      goto LAB_00e7d309;
    }
    local_24a8 = (ulong)((uint)uVar19 & 0xf) - 8;
    prim = (Primitive *)(uVar19 & 0xfffffffffffffff0);
    while (bVar30 = local_24a8 != 0, local_24a8 = local_24a8 + -1, bVar30) {
      InstanceArrayIntersector1::intersect(&local_24d1,ray,local_24b0,prim);
      auVar48 = ZEXT3264(local_2440);
      auVar47 = ZEXT3264(local_2420);
      auVar46 = ZEXT3264(local_2400);
      auVar45 = ZEXT3264(local_23e0);
      auVar44 = ZEXT3264(local_23c0);
      prim = prim + 1;
      ray = local_24b8;
      uVar23 = local_24d0;
      uVar24 = local_24c0;
      uVar25 = local_24c8;
    }
    fVar6 = (ray->super_RayK<1>).tfar;
    auVar31._4_4_ = fVar6;
    auVar31._0_4_ = fVar6;
    auVar31._8_4_ = fVar6;
    auVar31._12_4_ = fVar6;
    auVar31._16_4_ = fVar6;
    auVar31._20_4_ = fVar6;
    auVar31._24_4_ = fVar6;
    auVar31._28_4_ = fVar6;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }